

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

void __thiscall
helics::ValueFederateManager::startupToInitializeStateTransition(ValueFederateManager *this)

{
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5> *pDVar1;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *in_RDI;
  handle inpHandle;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  local_20;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(in_RDI);
  pDVar1 = gmlc::libguarded::
           lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
           ::operator->(&local_20);
  gmlc::containers::
  DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>::
  apply<helics::ValueFederateManager::startupToInitializeStateTransition()::__0>(pDVar1);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                  *)0x29ad3f);
  return;
}

Assistant:

void ValueFederateManager::startupToInitializeStateTransition()
{
    // get the actual publication types
    auto inpHandle = inputs.lock();
    inpHandle->apply([](auto& inp) { inp.loadSourceInformation(); });
}